

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-aligned.c
# Opt level: O2

void * mi_recalloc_aligned_at(void *p,size_t newcount,size_t size,size_t alignment,size_t offset)

{
  void *pvVar1;
  long in_FS_OFFSET;
  
  pvVar1 = mi_heap_recalloc_aligned_at
                     (*(mi_heap_t **)(in_FS_OFFSET + -0x28),p,newcount,size,alignment,offset);
  return pvVar1;
}

Assistant:

mi_decl_nodiscard void* mi_recalloc_aligned_at(void* p, size_t newcount, size_t size, size_t alignment, size_t offset) mi_attr_noexcept {
  return mi_heap_recalloc_aligned_at(mi_prim_get_default_heap(), p, newcount, size, alignment, offset);
}